

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ProductData * OpticsParser::parseBSDFXMLString(ProductData *__return_storage_ptr__,string *contents)

{
  bool bVar1;
  WindowElement *data;
  ostream *poVar2;
  runtime_error *this;
  string local_6b8 [32];
  stringstream local_698 [8];
  stringstream msg;
  ostream local_688 [392];
  undefined1 local_500 [8];
  optional<BSDFData::WindowElement> el;
  string *contents_local;
  
  el.super__Optional_base<BSDFData::WindowElement,_false,_false>._M_payload.
  super__Optional_payload<BSDFData::WindowElement,_true,_false,_false>.
  super__Optional_payload_base<BSDFData::WindowElement>._1248_8_ = contents;
  BSDFData::loadWindowElementFromString((optional<BSDFData::WindowElement> *)local_500,contents);
  bVar1 = std::optional<BSDFData::WindowElement>::has_value
                    ((optional<BSDFData::WindowElement> *)local_500);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_698);
    poVar2 = std::operator<<(local_688,"Cannot parse BSDFXML string: ");
    std::operator<<(poVar2,(string *)
                           el.super__Optional_base<BSDFData::WindowElement,_false,_false>._M_payload
                           .super__Optional_payload<BSDFData::WindowElement,_true,_false,_false>.
                           super__Optional_payload_base<BSDFData::WindowElement>._1248_8_);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_6b8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  data = std::optional<BSDFData::WindowElement>::operator*
                   ((optional<BSDFData::WindowElement> *)local_500);
  convert(__return_storage_ptr__,data);
  std::optional<BSDFData::WindowElement>::~optional((optional<BSDFData::WindowElement> *)local_500);
  return __return_storage_ptr__;
}

Assistant:

ProductData parseBSDFXMLString(std::string const & contents)
    {
        auto el = BSDFData::loadWindowElementFromString(contents);
        if(el.has_value())
        {
            return convert(*el);
        }

        // Tests are designed to throw exceptions if the file is not found.
        // This will allow tests to pass.
        std::stringstream msg;
        msg << "Cannot parse BSDFXML string: " << contents;
        throw std::runtime_error(msg.str());
    }